

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::emplace_back<>(SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *this)

{
  size_type sVar1;
  pointer puVar2;
  
  if (this->len == this->cap) {
    puVar2 = emplaceRealloc<>(this,this->data_ + this->len);
    return puVar2;
  }
  boost::unordered::
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_flat_set(this->data_ + this->len);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }